

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpruneL.c
# Opt level: O0

void dpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int_t iVar4;
  int *piVar5;
  int *piVar6;
  int_t *piVar7;
  int_t *piVar8;
  void *pvVar9;
  int_t *piVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int_t *xlusup;
  double *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int do_prune;
  int_t maxloc;
  int_t minloc;
  int_t ktemp;
  int_t i;
  int movnum;
  int krow;
  int kmax;
  int kmin;
  int irep1;
  int irep;
  int jsupno;
  double utemp;
  int *repfnz_local;
  int *segrep_local;
  int nseg_local;
  int pivrow_local;
  int *perm_r_local;
  int jcol_local;
  
  piVar5 = Glu->xsup;
  piVar6 = Glu->supno;
  piVar7 = Glu->lsub;
  piVar8 = Glu->xlsub;
  pvVar9 = Glu->lusup;
  piVar10 = Glu->xlusup;
  iVar2 = piVar6[jcol];
  minloc = 0;
  do {
    if (nseg <= minloc) {
      return;
    }
    iVar3 = segrep[minloc];
    iVar12 = iVar3 + 1;
    bVar11 = false;
    if (((repfnz[iVar3] != -1) && (piVar6[iVar3] != piVar6[iVar12])) && (piVar6[iVar3] != iVar2)) {
      if (piVar8[iVar12] <= xprune[iVar3]) {
        movnum = piVar8[iVar12] + -1;
        krow = piVar8[iVar3];
        for (i = krow; i <= movnum; i = i + 1) {
          if (piVar7[i] == pivrow) {
            bVar11 = true;
            break;
          }
        }
      }
      if (bVar11) {
        iVar12 = piVar5[piVar6[iVar3]];
        while (krow <= movnum) {
          if (perm_r[piVar7[movnum]] == -1) {
            movnum = movnum + -1;
          }
          else {
            if (perm_r[piVar7[krow]] == -1) {
              iVar4 = piVar7[krow];
              piVar7[krow] = piVar7[movnum];
              piVar7[movnum] = iVar4;
              if (iVar3 == iVar12) {
                iVar13 = piVar10[iVar3] + (krow - piVar8[iVar3]);
                iVar14 = piVar10[iVar3] + (movnum - piVar8[iVar3]);
                uVar1 = *(undefined8 *)((long)pvVar9 + (long)iVar13 * 8);
                *(undefined8 *)((long)pvVar9 + (long)iVar13 * 8) =
                     *(undefined8 *)((long)pvVar9 + (long)iVar14 * 8);
                *(undefined8 *)((long)pvVar9 + (long)iVar14 * 8) = uVar1;
              }
              movnum = movnum + -1;
            }
            krow = krow + 1;
          }
        }
        xprune[iVar3] = krow;
      }
    }
    minloc = minloc + 1;
  } while( true );
}

Assistant:

void
dpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    double     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    double     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (double *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After dpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}